

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

StringRef __thiscall llvm::ARM::getDefaultCPU(ARM *this,StringRef Arch)

{
  ArchKind AVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  StringRef SVar5;
  StringRef Arch_00;
  
  Arch_00.Length = Arch.Data;
  Arch_00.Data = (char *)this;
  AVar1 = parseArch(Arch_00);
  if (AVar1 == INVALID) {
    sVar3 = 0;
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = "generic";
    sVar3 = 7;
    for (lVar4 = 0x14; lVar4 != 0xa94; lVar4 = lVar4 + 0x20) {
      if ((*(ArchKind *)(&UNK_001f633c + lVar4) == AVar1) &&
         ((*(byte *)((long)&(anonymous_namespace)::CPUNames + lVar4) & 1) != 0)) {
        pcVar2 = *(char **)(&UNK_001f632c + lVar4);
        sVar3 = *(size_t *)(&UNK_001f6334 + lVar4);
        break;
      }
    }
  }
  SVar5.Length = sVar3;
  SVar5.Data = pcVar2;
  return SVar5;
}

Assistant:

StringRef llvm::ARM::getDefaultCPU(StringRef Arch) {
  ArchKind AK = parseArch(Arch);
  if (AK == ARM::ArchKind::INVALID)
    return StringRef();

  // Look for multiple AKs to find the default for pair AK+Name.
  for (const auto CPU : CPUNames) {
    if (CPU.ArchID == AK && CPU.Default)
      return CPU.getName();
  }

  // If we can't find a default then target the architecture instead
  return "generic";
}